

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

void __thiscall
irr::video::CNullDriver::runOcclusionQuery(CNullDriver *this,ISceneNode *node,bool visible)

{
  code *pcVar1;
  SOccQuery *pSVar2;
  IMesh *pIVar3;
  int iVar4;
  uint uVar5;
  __normal_iterator<const_irr::video::CNullDriver::SOccQuery_*,_std::vector<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>_>
  _Var6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar7;
  undefined4 extraout_var_01;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ISceneNode *pIStack_f0;
  undefined1 local_e8 [16];
  anon_union_8_2_439e2c06_for_SOccQuery_2 aStack_d8;
  matrix4 *local_d0 [17];
  u8 local_47;
  byte local_46;
  byte local_38;
  
  if (node != (ISceneNode *)0x0) {
    local_e8._8_8_ = (IMesh *)0x0;
    aStack_d8.PID = (void *)0x0;
    local_d0[0] = (matrix4 *)0xffffffffffffffff;
    pcVar1 = (code *)((long)(node->AbsoluteTransformation).M +
                     (long)(node->_vptr_ISceneNode[-3] + -0x20));
    *(int *)pcVar1 = *(int *)pcVar1 + 1;
    pIStack_f0 = (ISceneNode *)0x1cbb6e;
    local_e8._0_8_ = node;
    _Var6 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SOccQuery_const*,std::vector<irr::video::CNullDriver::SOccQuery,std::allocator<irr::video::CNullDriver::SOccQuery>>>,__gnu_cxx::__ops::_Iter_equals_val<irr::video::CNullDriver::SOccQuery_const>>
                      ((this->OcclusionQueries).m_data.
                       super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->OcclusionQueries).m_data.
                       super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_e8);
    pSVar2 = (this->OcclusionQueries).m_data.
             super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (long)_Var6._M_current -
            (long)(this->OcclusionQueries).m_data.
                  super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pIStack_f0 = (ISceneNode *)0x1cbb85;
    SOccQuery::~SOccQuery((SOccQuery *)local_e8);
    if ((int)(~uVar9 >> 5) != 0 && _Var6._M_current != pSVar2) {
      uVar9 = uVar9 >> 5 & 0xffffffff;
      (this->OcclusionQueries).m_data.
      super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar9].Run = 0;
      if (!visible) {
        pIStack_f0 = (ISceneNode *)0x1cbbc4;
        SMaterial::SMaterial((SMaterial *)local_e8);
        local_47 = '\0';
        local_46 = local_46 & 0xf0;
        local_38 = local_38 & 0xc3;
        pIStack_f0 = (ISceneNode *)0x1cbbeb;
        (*(this->super_IVideoDriver)._vptr_IVideoDriver[0xc])(this,local_e8);
        lVar10 = 0x80;
        do {
          if (*(void **)((long)&pIStack_f0 + lVar10) != (void *)0x0) {
            pIStack_f0 = (ISceneNode *)0x1cbc05;
            operator_delete(*(void **)((long)&pIStack_f0 + lVar10),0x40);
          }
          lVar10 = lVar10 + -0x20;
        } while (lVar10 != 0);
      }
      pIStack_f0 = (ISceneNode *)0x1cbc14;
      iVar4 = (*node->_vptr_ISceneNode[10])(node);
      pIStack_f0 = (ISceneNode *)0x1cbc25;
      (*(this->super_IVideoDriver)._vptr_IVideoDriver[6])(this,1,CONCAT44(extraout_var,iVar4));
      pIVar3 = (this->OcclusionQueries).m_data.
               super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].Mesh;
      pIStack_f0 = (ISceneNode *)0x1cbc36;
      iVar4 = (**pIVar3->_vptr_IMesh)(pIVar3);
      if (iVar4 != 0) {
        uVar9 = 0;
        do {
          if (visible) {
            pIStack_f0 = (ISceneNode *)0x1cbc4b;
            iVar4 = (*pIVar3->_vptr_IMesh[1])(pIVar3,uVar9);
            pIStack_f0 = (ISceneNode *)0x1cbc53;
            uVar7 = (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar4))
                              ((undefined8 *)CONCAT44(extraout_var_00,iVar4));
            pIStack_f0 = (ISceneNode *)0x1cbc5f;
            (*(this->super_IVideoDriver)._vptr_IVideoDriver[0xc])(this,uVar7);
          }
          pIStack_f0 = (ISceneNode *)0x1cbc6a;
          iVar4 = (*pIVar3->_vptr_IMesh[1])(pIVar3,uVar9);
          pIStack_f0 = (ISceneNode *)0x1cbc79;
          (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x36])
                    (this,CONCAT44(extraout_var_01,iVar4));
          uVar8 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar8;
          pIStack_f0 = (ISceneNode *)0x1cbc83;
          uVar5 = (**pIVar3->_vptr_IMesh)(pIVar3);
        } while (uVar8 < uVar5);
      }
    }
  }
  return;
}

Assistant:

void CNullDriver::runOcclusionQuery(scene::ISceneNode *node, bool visible)
{
	if (!node)
		return;
	s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index == -1)
		return;
	OcclusionQueries[index].Run = 0;
	if (!visible) {
		SMaterial mat;
		mat.Lighting = false;
		mat.AntiAliasing = 0;
		mat.ColorMask = ECP_NONE;
		mat.GouraudShading = false;
		mat.ZWriteEnable = EZW_OFF;
		setMaterial(mat);
	}
	setTransform(video::ETS_WORLD, node->getAbsoluteTransformation());
	const scene::IMesh *mesh = OcclusionQueries[index].Mesh;
	for (u32 i = 0; i < mesh->getMeshBufferCount(); ++i) {
		if (visible)
			setMaterial(mesh->getMeshBuffer(i)->getMaterial());
		drawMeshBuffer(mesh->getMeshBuffer(i));
	}
}